

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>::setCapacity
          (Vector<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *this,
          size_t newSize)

{
  Located<capnp::Text::Reader> *pLVar1;
  Located<capnp::Text::Reader> *__dest;
  Located<capnp::Text::Reader> *pLVar2;
  size_t __n;
  ArrayBuilder<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> local_58;
  
  pLVar1 = (this->builder).ptr;
  if (newSize < (ulong)(((long)(this->builder).pos - (long)pLVar1) / 0x18)) {
    (this->builder).pos = pLVar1 + newSize;
  }
  __dest = (Located<capnp::Text::Reader> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pLVar2 = __dest + newSize;
  local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pLVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pLVar1;
  local_58.ptr = __dest;
  local_58.endPtr = pLVar2;
  if (__n != 0) {
    memcpy(__dest,pLVar1,__n);
  }
  local_58.pos = (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
                  *)((long)__dest + __n);
  ArrayBuilder<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>::dispose
            (&this->builder);
  (this->builder).ptr = __dest;
  (this->builder).pos =
       (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)
       ((long)__dest + __n);
  (this->builder).endPtr = pLVar2;
  (this->builder).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_58.ptr = (Located<capnp::Text::Reader> *)0x0;
  local_58.pos = (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
                  *)0x0;
  local_58.endPtr = (Located<capnp::Text::Reader> *)0x0;
  ArrayBuilder<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>::dispose
            (&local_58);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }